

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O0

void __thiscall Network::run(Network *this,double runtime)

{
  ostream *poVar1;
  rep rVar2;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  Network *unaff_retaddr;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> duration;
  time_point stop;
  time_point start;
  Logging *in_stack_00000420;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffffb8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffc0;
  duration<long,_std::ratio<1L,_1000000L>_> local_28;
  undefined8 local_20;
  undefined8 local_18;
  double local_10;
  
  local_10 = in_XMM0_Qa;
  poVar1 = std::operator<<((ostream *)&std::cout,"Running network for ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10);
  poVar1 = std::operator<<(poVar1," seconds");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_18 = std::chrono::_V2::system_clock::now();
  Clock::setDt((Clock *)in_RDI[7].__d.__r,*(double *)in_RDI[3].__d.__r);
  while( true ) {
    dVar3 = Clock::getCurrentTime((Clock *)in_RDI[7].__d.__r);
    if (local_10 <= dVar3) break;
    Clock::tick((Clock *)in_RDI[7].__d.__r,*(double *)in_RDI[3].__d.__r);
    update(unaff_retaddr);
  }
  local_20 = std::chrono::_V2::system_clock::now();
  std::chrono::operator-(in_RDI,in_stack_ffffffffffffffc0);
  local_28.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                                (in_stack_ffffffffffffffb8);
  poVar1 = std::operator<<((ostream *)&std::cout,"Execution time: ");
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_28);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)rVar2 / 1000.0);
  poVar1 = std::operator<<(poVar1," milliseconds");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Logging::saveLog(in_stack_00000420);
  return;
}

Assistant:

void Network::run(double runtime) {
    cout << "Running network for " << runtime << " seconds" << endl;
    auto start = std::chrono::high_resolution_clock::now(); 
    clock->setDt(param->dt);
    while(clock->getCurrentTime() < runtime) {
        clock->tick(param->dt);
        update();
    }
    auto stop = std::chrono::high_resolution_clock::now();
    auto duration = std::chrono::duration_cast<std::chrono::microseconds>(stop - start); 
    cout << "Execution time: " << duration.count()/1000.0 << " milliseconds" << endl; 
    
    logger->saveLog();
}